

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtensionalityClauseContainer.cpp
# Opt level: O0

ExtensionalityClauseIterator __thiscall
Saturation::ExtensionalityClauseContainer::activeIterator
          (ExtensionalityClauseContainer *this,TermList sort)

{
  DelIterator inn;
  bool bVar1;
  List<Saturation::ExtensionalityClause> **l;
  undefined8 in_RDX;
  ExtensionalityClauseContainer *in_RSI;
  IteratorCore<Saturation::ExtensionalityClause> *in_RDI;
  DHMap<Kernel::TermList,_Lib::List<Saturation::ExtensionalityClause>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
  *in_stack_ffffffffffffff28;
  TermList in_stack_ffffffffffffff30;
  TermList *in_stack_ffffffffffffff40;
  DHMap<Kernel::TermList,_Lib::List<Saturation::ExtensionalityClause>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
  *in_stack_ffffffffffffff48;
  ActiveFilterFn in_stack_ffffffffffffff68;
  ActiveFilterFn local_88;
  List<Saturation::ExtensionalityClause> **in_stack_ffffffffffffff88;
  List<Saturation::ExtensionalityClause> *in_stack_ffffffffffffff90;
  FilteredIterator<Lib::List<Saturation::ExtensionalityClause>::DelIterator,_Saturation::ExtensionalityClauseContainer::ActiveFilterFn,_true>
  *in_stack_ffffffffffffff98;
  
  Lib::
  DHMap<Kernel::TermList,_Lib::List<Saturation::ExtensionalityClause>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
  ::find(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  bVar1 = Lib::Option::operator_cast_to_bool
                    ((Option<Lib::List<Saturation::ExtensionalityClause>_*&> *)0xac422b);
  if (bVar1) {
    l = Lib::
        DHMap<Kernel::TermList,_Lib::List<Saturation::ExtensionalityClause>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
        ::get(in_stack_ffffffffffffff28,in_stack_ffffffffffffff30);
    Lib::List<Saturation::ExtensionalityClause>::DelIterator::DelIterator
              ((DelIterator *)&stack0xffffffffffffff88,l);
    ActiveFilterFn::ActiveFilterFn(&local_88,in_RSI);
    inn._prev = (List<Saturation::ExtensionalityClause> *)in_stack_ffffffffffffff88;
    inn._lst = (List<Saturation::ExtensionalityClause> **)in_RDX;
    inn._cur = in_stack_ffffffffffffff90;
    Lib::
    getFilteredDelIterator<Lib::List<Saturation::ExtensionalityClause>::DelIterator,Saturation::ExtensionalityClauseContainer::ActiveFilterFn>
              (inn,in_stack_ffffffffffffff68);
    Lib::
    pvi<Lib::FilteredIterator<Lib::List<Saturation::ExtensionalityClause>::DelIterator,Saturation::ExtensionalityClauseContainer::ActiveFilterFn,true>>
              (in_stack_ffffffffffffff98);
    Lib::
    FilteredIterator<Lib::List<Saturation::ExtensionalityClause>::DelIterator,_Saturation::ExtensionalityClauseContainer::ActiveFilterFn,_true>
    ::~FilteredIterator((FilteredIterator<Lib::List<Saturation::ExtensionalityClause>::DelIterator,_Saturation::ExtensionalityClauseContainer::ActiveFilterFn,_true>
                         *)0xac42af);
  }
  else {
    Lib::VirtualIterator<Saturation::ExtensionalityClause>::getEmpty();
  }
  return (ExtensionalityClauseIterator)in_RDI;
}

Assistant:

ExtensionalityClauseIterator ExtensionalityClauseContainer::activeIterator(TermList sort) {
  if(_clausesBySort.find(sort)){
    return pvi(getFilteredDelIterator(
               ExtensionalityClauseList::DelIterator(_clausesBySort.get(sort)),
               ActiveFilterFn(*this)));
  } else {
    return ExtensionalityClauseIterator::getEmpty();
  }
}